

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O1

void __thiscall
MmapReader::file_helper::file_helper
          (file_helper *this,string *name,uint64_t size,bool creatnew,bool opencreate)

{
  undefined3 in_register_00000009;
  FileReader w;
  FileReader FStack_58;
  
  (this->fname)._M_dataplus._M_p = (pointer)&(this->fname).field_2;
  (this->fname)._M_string_length = 0;
  (this->fname).field_2._M_local_buf[0] = '\0';
  this->tsize = 0;
  this->trunc = false;
  if (CONCAT31(in_register_00000009,creatnew) == 0) {
    if (opencreate) {
      FileReader::FileReader(&FStack_58);
    }
    else {
      FileReader::FileReader(&FStack_58);
    }
  }
  else {
    FileReader::FileReader(&FStack_58);
  }
  FileReader::~FileReader(&FStack_58);
  return;
}

Assistant:

file_helper(const std::string& name, uint64_t size, bool creatnew, bool opencreate)
            : tsize(0), trunc(false)
        {
            if (creatnew) {
                FileReader w(name, FileReader::createnew);
                //w.truncate(size);
            }
            else if (opencreate) {
                FileReader w(name, FileReader::opencreate);
                //w.truncate(size);
            }
            else {
                FileReader w(name, FileReader::readwrite);
                //w.truncate(size);
            }
        }